

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O1

TraceSubResult *
geometrycentral::surface::anon_unknown_2::traceInFaceBarycentric
          (TraceSubResult *__return_storage_ptr__,IntrinsicGeometryInterface *geom,Face face,
          Vector3 startPoint,Vector3 vecBary,Vector2 vecCartesianDir,double vecCartesianLen,
          array<bool,_3UL> edgeIsHittable,TraceOptions *traceOptions)

{
  Vector2 *pVVar1;
  Vector2 *pVVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  runtime_error *this;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  ParentMeshT *pPVar13;
  long lVar14;
  code *pcVar15;
  long lVar16;
  undefined *puVar17;
  unsigned_long uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ParentMeshT *pPVar22;
  double dVar23;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar24;
  undefined1 auVar27 [64];
  double dVar28;
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined2 local_c4;
  undefined1 local_c2;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88 [4];
  double local_68 [4];
  undefined1 local_48 [16];
  double local_38;
  undefined8 uStack_30;
  undefined1 auVar29 [16];
  
  auVar30._8_56_ = vecCartesianDir._16_56_;
  auVar30._0_8_ = vecCartesianDir.y;
  auVar29 = auVar30._0_16_;
  auVar27._8_56_ = vecCartesianDir._8_56_;
  auVar27._0_8_ = vecCartesianDir.x;
  sVar10 = face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
           .ind;
  pPVar13 = face.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
            mesh;
  auVar25 = auVar27._0_16_;
  local_c4 = edgeIsHittable._M_elems._0_2_;
  local_c2 = edgeIsHittable._M_elems[2];
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  uVar18 = (pPVar13->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar10];
  pVVar2 = (geom->halfedgeVectorsInFace).data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  pVVar1 = pVVar2 + uVar18;
  local_68[2] = pVVar1->x;
  local_68[3] = pVVar1->y;
  puVar3 = (pPVar13->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  local_48 = vxorpd_avx512vl((undefined1  [16])pVVar2[puVar3[puVar3[uVar18]]],auVar4);
  if ((startPoint.z + startPoint.x + startPoint.y < 0.5) && (traceOptions->errorOnProblem == true))
  {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this,"bad bary point");
LAB_001b3b4a:
    puVar17 = &::std::runtime_error::typeinfo;
    pcVar15 = ::std::runtime_error::~runtime_error;
LAB_001b3b58:
    __cxa_throw(this,puVar17,pcVar15);
  }
  auVar36._0_8_ = vecBary.x + startPoint.x;
  auVar36._8_8_ = vecBary.y + startPoint.y;
  if (((0.0 <= auVar36._0_8_) && (auVar4 = vshufpd_avx(auVar36,auVar36,1), 0.0 <= auVar4._0_8_)) &&
     (0.0 <= startPoint.z + vecBary.z)) {
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).tEdge = NAN;
    __return_storage_ptr__->terminated = true;
    (__return_storage_ptr__->endPoint).type = Face;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPVar13;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         sVar10;
    (__return_storage_ptr__->endPoint).faceCoords.x = auVar36._0_8_;
    (__return_storage_ptr__->endPoint).faceCoords.y = auVar36._8_8_;
    (__return_storage_ptr__->endPoint).faceCoords.z = startPoint.z + vecBary.z;
LAB_001b37c3:
    (__return_storage_ptr__->incomingDirToPoint).x = auVar27._0_8_;
    (__return_storage_ptr__->incomingDirToPoint).y = auVar30._0_8_;
    return __return_storage_ptr__;
  }
  uVar20 = 0xffffffffffffffff;
  uVar8 = 0xfffffcf7;
  auVar38 = ZEXT1664(ZEXT816(0x7ff0000000000000));
  pPVar22 = (ParentMeshT *)0x0;
  uVar12 = 0;
  do {
    uVar18 = (pPVar13->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar18];
    uVar19 = uVar12 + 1;
    uVar21 = 0;
    if (uVar12 != 2) {
      uVar21 = uVar19;
    }
    if (((*(char *)((long)&local_c4 + uVar21) == '\x01') && ((&vecBary.x)[uVar12] < 0.0)) &&
       (dVar41 = -(&startPoint.x)[uVar12] / (&vecBary.x)[uVar12], dVar41 < auVar38._0_8_)) {
      uVar8 = uVar12 & 0xffffffff;
      auVar38 = ZEXT1664(CONCAT88(0x8000000000000000,dVar41));
      uVar20 = uVar18;
      pPVar22 = pPVar13;
    }
    uVar12 = uVar19;
  } while (uVar19 != 3);
  if (uVar20 == 0xffffffffffffffff) {
    if (traceOptions->errorOnProblem != true) {
      (__return_storage_ptr__->crossHe).
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = (ParentMeshT *)0x0;
      (__return_storage_ptr__->crossHe).
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).type = Vertex;
      (__return_storage_ptr__->endPoint).vertex.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).vertex.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).edge.
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).edge.
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).tEdge = NAN;
      (__return_storage_ptr__->endPoint).face.
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).face.
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
      (__return_storage_ptr__->endPoint).faceCoords.y = NAN;
      (__return_storage_ptr__->endPoint).faceCoords.z = NAN;
      __return_storage_ptr__->terminated = true;
      (__return_storage_ptr__->endPoint).faceCoords.x = startPoint.x;
      (__return_storage_ptr__->endPoint).faceCoords.y = startPoint.y;
      (__return_storage_ptr__->endPoint).faceCoords.z = startPoint.z;
      (__return_storage_ptr__->endPoint).type = Face;
      (__return_storage_ptr__->endPoint).vertex.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).vertex.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).edge.
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).edge.
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).tEdge = NAN;
      (__return_storage_ptr__->endPoint).face.
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           pPVar13;
      (__return_storage_ptr__->endPoint).face.
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           sVar10;
      goto LAB_001b37c3;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error
              ((logic_error *)this,"no halfedge intersection was selected, precondition problem?");
    puVar17 = &::std::logic_error::typeinfo;
    pcVar15 = ::std::logic_error::~logic_error;
    goto LAB_001b3b58;
  }
  auVar43 = ZEXT816(0) << 0x40;
  auVar4 = vmaxsd_avx(auVar43,auVar38._0_16_);
  uVar5 = vcmpsd_avx512f(ZEXT816(0x3fefffffff768fa1),auVar38._0_16_,1);
  bVar6 = (bool)((byte)uVar5 & 1);
  dVar23 = (double)((ulong)bVar6 * 0x3fefffffff768fa1 + (ulong)!bVar6 * auVar4._0_8_);
  local_88[0] = startPoint.x + vecBary.x * dVar23;
  local_88[1] = startPoint.y + vecBary.y * dVar23;
  local_88[2] = startPoint.z + dVar23 * vecBary.z;
  iVar7 = (int)uVar8;
  lVar11 = (long)(iVar7 + 2 + ((iVar7 + 2) / 3) * -3);
  dVar41 = local_88[lVar11];
  lVar9 = (long)(iVar7 + 1 + ((iVar7 + 1) / 3) * -3);
  dVar33 = local_68[lVar11 * 2] - local_68[lVar9 * 2];
  dVar28 = local_68[lVar11 * 2 + 1] - local_68[lVar9 * 2 + 1];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar28 * dVar28;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar33;
  auVar36 = vfmadd231sd_fma(auVar26,auVar34,auVar34);
  if (auVar36._0_8_ < 0.0) {
    local_c0 = dVar28;
    local_b8 = dVar33;
    local_b0 = dVar41 + local_88[lVar9];
    local_a8 = dVar41;
    local_a0 = auVar27._0_8_;
    local_98 = auVar30._0_8_;
    local_90 = vecCartesianLen;
    local_38 = dVar23;
    uStack_30 = auVar4._8_8_;
    dVar24 = sqrt(auVar36._0_8_);
    auVar43 = ZEXT816(0) << 0x40;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_a0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_98;
    dVar33 = local_b8;
    dVar28 = local_c0;
    dVar42 = local_b0;
    dVar23 = local_38;
    vecCartesianLen = local_90;
    dVar41 = local_a8;
  }
  else {
    auVar4 = vsqrtsd_avx(auVar36,auVar36);
    dVar24 = auVar4._0_8_;
    dVar42 = dVar41 + local_88[lVar9];
  }
  dVar33 = dVar33 * (1.0 / dVar24);
  dVar28 = dVar28 * (1.0 / dVar24);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar28 * dVar28;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar33;
  auVar4 = vfmadd231sd_fma(auVar37,auVar39,auVar39);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar28 * auVar29._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar33;
  auVar36 = vfmadd231sd_fma(auVar31,auVar25,auVar40);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar25._0_8_ * dVar28;
  auVar25 = vfmsub231sd_fma(auVar35,auVar29,auVar40);
  dVar28 = 1.0 / auVar4._0_8_;
  dVar33 = auVar36._0_8_ * dVar28;
  dVar28 = auVar25._0_8_ * dVar28;
  if (((0x7fefffffffffffff < (long)ABS(dVar33)) || (0x7fefffffffffffff < (long)ABS(dVar28))) &&
     (traceOptions->errorOnProblem == true)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this,"bad value transforming to new edge. is there a zero-length edge?");
    goto LAB_001b3b4a;
  }
  auVar32._0_8_ = dVar41 / dVar42;
  auVar32._8_8_ = 0;
  auVar4 = vmaxsd_avx(auVar43,auVar32);
  uVar5 = vcmpsd_avx512f(ZEXT816(0x3ff0000000000000),auVar32,1);
  bVar6 = (bool)((byte)uVar5 & 1);
  dVar41 = (double)((ulong)bVar6 * 0x3ff0000000000000 + (ulong)!bVar6 * auVar4._0_8_);
  bVar6 = pPVar22->useImplicitTwinFlag;
  if (bVar6 == true) {
    uVar12 = uVar20 ^ 1;
  }
  else {
    uVar12 = (pPVar22->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20];
  }
  if ((pPVar22->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start[uVar12] < pPVar22->nFacesFillCount) {
    if (traceOptions->barrierEdges != (EdgeData<bool> *)0x0) {
      if (bVar6 == false) {
        uVar12 = (pPVar22->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20];
      }
      else {
        uVar12 = uVar20 >> 1;
      }
      if ((traceOptions->barrierEdges->data).
          super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] ==
          true) goto LAB_001b393c;
    }
    dVar23 = (1.0 - dVar23) * vecCartesianLen;
    (__return_storage_ptr__->endPoint).type = Vertex;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).tEdge = NAN;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.y = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.z = NAN;
    __return_storage_ptr__->terminated = false;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPVar22;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         uVar20;
    lVar9 = 0x30;
    lVar11 = 0x28;
    lVar14 = 0x20;
    lVar16 = 0x18;
  }
  else {
LAB_001b393c:
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).type = Vertex;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).tEdge = NAN;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.y = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.z = NAN;
    __return_storage_ptr__->terminated = true;
    if (bVar6 == false) {
      uVar12 = (pPVar22->heEdgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20];
      uVar8 = (pPVar22->eHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [(pPVar22->heEdgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20]];
    }
    else {
      uVar12 = uVar20 >> 1;
      uVar8 = uVar20 & 0xfffffffffffffffe;
    }
    (__return_storage_ptr__->endPoint).type = Edge;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPVar22;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         uVar12;
    (__return_storage_ptr__->endPoint).tEdge =
         (double)((ulong)(uVar8 == uVar20) * (long)dVar41 +
                 (ulong)(uVar8 != uVar20) * (long)(1.0 - dVar41));
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
    lVar9 = 0x98;
    lVar11 = 0x90;
    lVar14 = 0x88;
    dVar41 = NAN;
    lVar16 = 0x80;
    dVar23 = dVar28;
    dVar28 = dVar33;
    dVar33 = NAN;
  }
  *(double *)(&__return_storage_ptr__->terminated + lVar16) = dVar41;
  *(double *)(&__return_storage_ptr__->terminated + lVar14) = dVar33;
  *(double *)(&__return_storage_ptr__->terminated + lVar11) = dVar28;
  *(double *)(&__return_storage_ptr__->terminated + lVar9) = dVar23;
  return __return_storage_ptr__;
}

Assistant:

inline TraceSubResult traceInFaceBarycentric(IntrinsicGeometryInterface& geom, Face face, Vector3 startPoint,
                                             Vector3 vecBary, Vector2 vecCartesianDir, double vecCartesianLen,
                                             std::array<bool, 3> edgeIsHittable, const TraceOptions& traceOptions) {

  // Gather values
  std::array<Vector2, 3> vertexCoords = vertexCoordinatesInTriangle(geom, face);
  Vector3 triangleLengths{geom.edgeLengths[face.halfedge().edge()], geom.edgeLengths[face.halfedge().next().edge()],
                          geom.edgeLengths[face.halfedge().next().next().edge()]};

  if (sum(startPoint) < 0.5) {
    if (TRACE_PRINT) {
      cout << "  bad bary point: " << startPoint << endl;
    }
    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("bad bary point");
    }
  }

  if (TRACE_PRINT) {
    cout << "  general trace in face: " << endl;
    cout << "  face: " << face << " startPoint " << startPoint << " vecBary = " << vecBary << " vecCartesian "
         << vecCartesianDir << " " << vecCartesianLen << endl;
  }

  if (TRACE_PRINT) {
    cout << "  vec bary  = " << vecBary << endl;
    cout << "  reconvert = " << cartesianVectorToBarycentric(vertexCoords, vecCartesianDir) * vecCartesianLen << endl;
  }

  // Test if the vector ends in the triangle
  Vector3 endPoint = startPoint + vecBary;
  if (TRACE_PRINT) {
    cout << "    endpoint: " << endPoint << endl;
  }

  /*
  if (isInsideTriangle(endPoint)) {
    // Fancy test if ending on edges
    // (to detect when we're within eps of edge)
    bool foundEpsEdge = false;
    if (traceOptions.allowEndOnEdge) {
      double A = 0.5 * cross(vertexCoords[1] - vertexCoords[0], vertexCoords[2] - vertexCoords[0]);
      Halfedge endHe = face.halfedge();
      for (int i = 0; i < 3; i++) {
        double dist = 2. * endPoint[i] * A / triangleLengths[i]; // perp distance to edge
        if (endPoint[i] > 0 && dist < traceOptions.allowEndOnEdgeEps) {
          // force the process below to hit this edge, let other logic proceed
          edgeIsHittable[i] = true;
          edgeIsHittable[(i + 1) % 3] = false;
          edgeIsHittable[(i + 2) % 3] = false;
          foundEpsEdge = true;
          break;
        }
      }
    }
    // Simple test if not ending on edges
    if (!foundEpsEdge) {
      // The trace ended! Call it a day.
      TraceSubResult result;
      result.terminated = true;
      result.endPoint = SurfacePoint(face, endPoint);
      result.incomingDirToPoint = vecCartesian;
      return result;
    }
  }
  */

  if (isInsideTriangle(endPoint)) {
    // The trace ended! Call it a day.
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(face, endPoint);
    result.incomingDirToPoint = vecCartesianDir;
    return result;
  }


  // The vector did not end in this triangle. Pick an appropriate point along some edge
  double tRay = std::numeric_limits<double>::infinity();
  Halfedge crossHe = Halfedge();
  int iOppVertEnd = -777;
  Halfedge currHe = face.halfedge();
  for (int i = 0; i < 3; i++) {
    currHe = currHe.next(); // always opposite the i'th vertex

    // Check the crossing
    double tRayThisRaw = -startPoint[i] / vecBary[i];
    double tRayThis = clamp(tRayThisRaw, 0., 1. - TRACE_EPS_LOOSE);

    if (TRACE_PRINT) {
      cout << "    considering intersection:" << endl;
      cout << std::boolalpha;
      cout << "      hittable[(i+1)%3]: " << edgeIsHittable[(i + 1) % 3] << endl;
      cout << "      vecBary[i]: " << vecBary[i] << endl;
      cout << "      startPoint[i]: " << startPoint[i] << endl;
      cout << "      tRayThisRaw: " << tRayThisRaw << endl;
      cout << "      tRayThis: " << tRayThis << endl;
    }


    if (!edgeIsHittable[(i + 1) % 3] || vecBary[i] >= 0) {
      // note should ALWAYS satisfy precondition that vecBary[i] is negative for at least one hittable edge.
      // if not, fix projection of inputs in caller
      continue;
    }

    if (tRayThisRaw < tRay) {
      // This is the new closest intersection
      tRay = tRayThisRaw;
      crossHe = currHe;
      iOppVertEnd = i;
    }
  }

  if (TRACE_PRINT) {
    cout << "    selected intersection:" << endl;
    cout << "      crossHe: " << crossHe << endl;
    cout << "      tRay: " << tRay << endl;
    cout << "      iOppVertEnd: " << iOppVertEnd << endl;
  }

  // Clamp to a sane range
  tRay = clamp(tRay, 0., 1. - TRACE_EPS_LOOSE);


  if (crossHe == Halfedge()) {
    if (traceOptions.errorOnProblem) {
      throw std::logic_error("no halfedge intersection was selected, precondition problem?");
    }
    if (TRACE_PRINT) {
      cout << "    PROBLEM PROBLEM NO INTERSECTION:" << endl;
    }

    // End immediately
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(face, startPoint);
    result.incomingDirToPoint = vecCartesianDir;
    return result;
  }

  // Compute some useful info about the endpoint
  Vector3 endPointOnEdge = startPoint + tRay * vecBary;
  double tCross = endPointOnEdge[(iOppVertEnd + 2) % 3] /
                  (endPointOnEdge[(iOppVertEnd + 1) % 3] + endPointOnEdge[(iOppVertEnd + 2) % 3]);
  if (TRACE_PRINT) {
    cout << "    end point on edge: " << endPointOnEdge << endl;
    cout << "    tCross raw: " << tCross << endl;
  }
  tCross = clamp(tCross, 0., 1.);

  // Rotate the vector in to the frame of crossHe and shorten it
  double lenRemaining = (1.0 - tRay) * vecCartesianLen;
  Vector2 crossingEdgeVec = (vertexCoords[(iOppVertEnd + 2) % 3] - vertexCoords[(iOppVertEnd + 1) % 3]);
  Vector2 remainingDirInHalfedge = vecCartesianDir / crossingEdgeVec.normalize();
  if (!isfinite(remainingDirInHalfedge)) {
    if (TRACE_PRINT) {
      cout << "    NON FINITE REMAINING TRACE" << endl;
      cout << "    lenRemaining = " << lenRemaining << endl;
      cout << "    crossingEdgeVec = " << crossingEdgeVec << endl;
      cout << "    remainingDirInHalfedge = " << remainingDirInHalfedge << endl;
    }

    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("bad value transforming to new edge. is there a zero-length edge?");
    }
  }


  // Stop tracing if we hit a boundary
  if (!crossHe.twin().isInterior() || (traceOptions.barrierEdges && (*traceOptions.barrierEdges)[crossHe.edge()])) {
    // Build the result
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(crossHe.edge(), convertTToEdge(crossHe, tCross));
    result.incomingDirToPoint = remainingDirInHalfedge;

    return result;
  }

  // Build the result
  TraceSubResult result;
  result.terminated = false;
  result.crossHe = crossHe;
  result.tCross = tCross;
  result.traceVectorInHalfedgeDir = remainingDirInHalfedge;
  result.traceVectorInHalfedgeLen = lenRemaining;
  return result;
}